

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O0

void __thiscall
ConfidentialTransaction_GetIssuanceBlindingKeyTest_Test::TestBody
          (ConfidentialTransaction_GetIssuanceBlindingKeyTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_148;
  Message local_140;
  string local_138;
  undefined1 local_118 [8];
  AssertionResult gtest_ar;
  Message local_100 [2];
  Privkey local_f0;
  undefined1 local_d0 [8];
  Privkey key;
  uint32_t vout;
  undefined1 local_88 [8];
  Txid txid;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  Privkey masterkey;
  ConfidentialTransaction_GetIssuanceBlindingKeyTest_Test *this_local;
  
  masterkey._24_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,"a0cd219833629db30c5210716c7b2e22fb8dd10aa231692f1f53acd8e662de01",
             &local_51);
  cfd::core::Privkey::Privkey((Privkey *)local_30,&local_50,kMainnet,true);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&vout,"21fe3fc8e38256ec747fa8d8ea96319fd00cbcf318c2586b9b8e9e27a5afe9aa",
             (allocator *)((long)&key.net_type_ + 3));
  cfd::core::Txid::Txid((Txid *)local_88,(string *)&vout);
  std::__cxx11::string::~string((string *)&vout);
  std::allocator<char>::~allocator((allocator<char> *)((long)&key.net_type_ + 3));
  key.is_compressed_ = false;
  key._25_3_ = 0;
  cfd::core::Privkey::Privkey((Privkey *)local_d0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::GetIssuanceBlindingKey
                (&local_f0,(Privkey *)local_30,(Txid *)local_88,key._24_4_);
      cfd::core::Privkey::operator=((Privkey *)local_d0,&local_f0);
      cfd::core::Privkey::~Privkey(&local_f0);
    }
  }
  else {
    testing::Message::Message(local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x748,
               "Expected: (key = ConfidentialTransaction::GetIssuanceBlindingKey( masterkey, txid, vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(local_100);
  }
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_138,(Privkey *)local_d0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_118,"key.GetHex().c_str()",
             "\"24c10c3b128f220e3b4253cec39ea3b75d2f6000033508c8deeadc1b6eefc4a1\"",pcVar2,
             "24c10c3b128f220e3b4253cec39ea3b75d2f6000033508c8deeadc1b6eefc4a1");
  std::__cxx11::string::~string((string *)&local_138);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x74c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_148,&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  cfd::core::Privkey::~Privkey((Privkey *)local_d0);
  cfd::core::Txid::~Txid((Txid *)local_88);
  cfd::core::Privkey::~Privkey((Privkey *)local_30);
  return;
}

Assistant:

TEST(ConfidentialTransaction, GetIssuanceBlindingKeyTest) {
  Privkey masterkey(
      "a0cd219833629db30c5210716c7b2e22fb8dd10aa231692f1f53acd8e662de01");
  Txid txid(
      "21fe3fc8e38256ec747fa8d8ea96319fd00cbcf318c2586b9b8e9e27a5afe9aa");
  uint32_t vout = 0;
  Privkey key;
  EXPECT_NO_THROW(
    (key = ConfidentialTransaction::GetIssuanceBlindingKey(
        masterkey, txid, vout)));

  EXPECT_STREQ(
      key.GetHex().c_str(),
      "24c10c3b128f220e3b4253cec39ea3b75d2f6000033508c8deeadc1b6eefc4a1");
}